

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
IsObjTypeSpecEquivalentImpl<false>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,Type *type,
          EquivalentPropertyEntry *entry)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  ScriptContext *this_00;
  undefined4 *puVar4;
  uint uVar5;
  int iVar6;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_30;
  int i;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  this_00 = Js::Type::GetScriptContext(type);
  local_40 = ScriptContext::GetPropertyName(this_00,entry->propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&stack0xffffffffffffffd0,
                     (int *)((long)&propertyRecord + 4));
  uVar5 = 0xffff;
  if ((bVar3) && ((pSStack_30->Attributes & 8) == 0)) {
    iVar6 = pSStack_30->propertyIndex;
    if (iVar6 < 0xffff) {
      if ((ushort)iVar6 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                    ,0xaf,"(slotIndex != Constants::NoSlot)",
                                    "slotIndex != Constants::NoSlot");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar5 = -(uint)uVar1;
      if ((ushort)iVar6 < uVar1) {
        uVar5 = (uint)((this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3);
      }
      uVar5 = uVar5 + iVar6 & 0xffff;
    }
  }
  else {
    iVar6 = 0xffff;
  }
  if (uVar5 == 0xffff) {
    if ((entry->slotIndex == 0xffff) && (entry->mustBeWritable == false)) {
      return true;
    }
  }
  else if ((uVar5 == entry->slotIndex) &&
          (entry->isAuxSlot ==
           (int)(uint)(this->super_DynamicTypeHandler).inlineSlotCapacity <= iVar6)) {
    if (entry->mustBeWritable != true) {
      return true;
    }
    if (((pSStack_30->Attributes & 4) != 0) && (((ulong)*pSStack_30 & 6) == 2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        TPropertyIndex absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        ScriptContext* scriptContext = type->GetScriptContext();

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            absSlotIndex = descriptor->propertyIndex;
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }